

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_schema.cpp
# Opt level: O2

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformCreateSchema(Transformer *this,PGCreateSchemaStmt *stmt)

{
  undefined8 *puVar1;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var2;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var3;
  OnCreateConflict OVar4;
  pointer pCVar5;
  pointer pCVar6;
  NotImplementedException *this_00;
  long in_RDX;
  pointer *__ptr;
  Transformer *this_01;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_58;
  allocator local_49;
  optional_ptr<duckdb_libpgquery::PGNode,_true> node;
  string local_40;
  
  make_uniq<duckdb::CreateStatement>();
  make_uniq<duckdb::CreateSchemaInfo>();
  pCVar5 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
                         *)&local_58);
  ::std::__cxx11::string::assign((char *)&(pCVar5->super_CreateInfo).catalog);
  pCVar5 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
                         *)&local_58);
  this_01 = (Transformer *)&(pCVar5->super_CreateInfo).schema;
  ::std::__cxx11::string::assign((char *)this_01);
  OVar4 = TransformOnConflict(this_01,*(PGOnCreateConflict *)(in_RDX + 0x20));
  pCVar5 = unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateSchemaInfo,_std::default_delete<duckdb::CreateSchemaInfo>,_true>
                         *)&local_58);
  _Var3._M_head_impl = local_58._M_head_impl;
  (pCVar5->super_CreateInfo).on_conflict = OVar4;
  if ((*(long *)(in_RDX + 0x18) != 0) &&
     (puVar1 = *(undefined8 **)(*(long *)(in_RDX + 0x18) + 8), puVar1 != (undefined8 *)0x0)) {
    node.ptr = (PGNode *)*puVar1;
    optional_ptr<duckdb_libpgquery::PGNode,_true>::operator->(&node);
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Schema element not supported yet!",&local_49);
    NotImplementedException::NotImplementedException(this_00,&local_40);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_58._M_head_impl = (CreateInfo *)0x0;
  pCVar6 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>::
           operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                       *)this);
  _Var2._M_head_impl =
       (pCVar6->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
       ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (pCVar6->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t
  .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (CreateInfo *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_ParseInfo + 8))();
  }
  if (local_58._M_head_impl != (CreateInfo *)0x0) {
    (*((local_58._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
         (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)this;
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformCreateSchema(duckdb_libpgquery::PGCreateSchemaStmt &stmt) {
	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateSchemaInfo>();

	D_ASSERT(stmt.schemaname);
	info->catalog = stmt.catalogname ? stmt.catalogname : INVALID_CATALOG;
	info->schema = stmt.schemaname;
	info->on_conflict = TransformOnConflict(stmt.onconflict);

	if (stmt.schemaElts) {
		// schema elements
		for (auto cell = stmt.schemaElts->head; cell != nullptr; cell = cell->next) {
			auto node = PGPointerCast<duckdb_libpgquery::PGNode>(cell->data.ptr_value);
			switch (node->type) {
			case duckdb_libpgquery::T_PGCreateStmt:
			case duckdb_libpgquery::T_PGViewStmt:
			default:
				throw NotImplementedException("Schema element not supported yet!");
			}
		}
	}
	result->info = std::move(info);
	return result;
}